

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O3

fdb_status fdb_doc_update(fdb_doc **doc,void *meta,size_t metalen,void *body,size_t bodylen)

{
  fdb_status fVar1;
  void *pvVar2;
  fdb_doc *pfVar3;
  
  if ((0xffff < metalen || doc == (fdb_doc **)0x0) || bodylen >> 0x20 != 0) {
    return FDB_RESULT_INVALID_ARGS;
  }
  pfVar3 = *doc;
  if (pfVar3 == (fdb_doc *)0x0) {
    return FDB_RESULT_INVALID_ARGS;
  }
  if (metalen == 0 || meta == (void *)0x0) {
LAB_00133c22:
    if (bodylen != 0 && body != (void *)0x0) {
      free(pfVar3->body);
      pvVar2 = malloc(bodylen);
      (*doc)->body = pvVar2;
      if ((*doc)->body == (void *)0x0) goto LAB_00133c74;
      memcpy((*doc)->body,body,bodylen);
      pfVar3 = *doc;
      pfVar3->bodylen = bodylen;
    }
    pfVar3->seqnum = 0xffffffffffffffff;
    fVar1 = FDB_RESULT_SUCCESS;
  }
  else {
    free(pfVar3->meta);
    pvVar2 = malloc(metalen);
    (*doc)->meta = pvVar2;
    if ((*doc)->meta != (void *)0x0) {
      memcpy((*doc)->meta,meta,metalen);
      pfVar3 = *doc;
      pfVar3->metalen = metalen;
      goto LAB_00133c22;
    }
LAB_00133c74:
    fVar1 = FDB_RESULT_ALLOC_FAIL;
  }
  return fVar1;
}

Assistant:

LIBFDB_API
fdb_status fdb_doc_update(fdb_doc **doc,
                          const void *meta, size_t metalen,
                          const void *body, size_t bodylen)
{
    if (doc == NULL ||
        metalen > FDB_MAX_METALEN || bodylen > FDB_MAX_BODYLEN) {
        return FDB_RESULT_INVALID_ARGS;
    }
    if (*doc == NULL) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (meta && metalen > 0) {
        // free previous metadata
        free((*doc)->meta);
        // allocate new metadata
        (*doc)->meta = (void *)malloc(metalen);
        if ((*doc)->meta == NULL) { // LCOV_EXCL_START
            return FDB_RESULT_ALLOC_FAIL;
        } // LCOV_EXCL_STOP
        memcpy((*doc)->meta, meta, metalen);
        (*doc)->metalen = metalen;
    }

    if (body && bodylen > 0) {
        // free previous body
        free((*doc)->body);
        // allocate new body
        (*doc)->body = (void *)malloc(bodylen);
        if ((*doc)->body == NULL) { // LCOV_EXCL_START
            return FDB_RESULT_ALLOC_FAIL;
        } // LCOV_EXCL_STOP
        memcpy((*doc)->body, body, bodylen);
        (*doc)->bodylen = bodylen;
    }

    (*doc)->seqnum = SEQNUM_NOT_USED;
    return FDB_RESULT_SUCCESS;
}